

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_options.h
# Opt level: O3

void __thiscall google::protobuf::compiler::java::Options::~Options(Options *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->output_list_file)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->output_list_file).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->annotation_list_file)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->annotation_list_file).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Options()
      : generate_immutable_code(false),
        generate_mutable_code(false),
        generate_shared_code(false),
        enforce_lite(false),
        annotate_code(false) {
  }